

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_fini.c
# Opt level: O1

void mpt_history_fini(mpt_history *hist)

{
  FILE *__stream;
  
  mpt_array_clone(&hist->fmt,0);
  mpt_array_clone(&(hist->fmt)._dat,0);
  __stream = (FILE *)(hist->info).file;
  if (((__stream != (FILE *)0x0) && (__stream != _stdout)) && (__stream != _stderr)) {
    fclose(__stream);
  }
  (hist->fmt)._fmt._buf = (mpt_buffer *)0x0;
  (hist->fmt)._dat._buf = (mpt_buffer *)0x0;
  (hist->info).file = (FILE *)0x0;
  (hist->info).state = '\0';
  (hist->info).mode = '\0';
  (hist->info).ignore = '\0';
  (hist->info).lsep = '\0';
  *(undefined4 *)&(hist->info).field_0xc = 0;
  (hist->fmt).pos = '\0';
  (hist->fmt).fmt = '\0';
  *(undefined6 *)&(hist->fmt).field_0x12 = 0;
  return;
}

Assistant:

extern void mpt_history_fini(MPT_STRUCT(history) *hist)
{
	static const MPT_STRUCT(history) def = MPT_HISTORY_INIT;
	FILE *fd;
	/* clear file output resources */
	mpt_array_clone(&hist->fmt._fmt, 0);
	mpt_array_clone(&hist->fmt._dat, 0);
	
	if ((fd = hist->info.file) && fd != stdout && fd != stderr) {
		fclose(fd);
	}
	*hist = def;
}